

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# temp.cpp
# Opt level: O0

void __thiscall Pathie::Tempfile::Tempfile(Tempfile *this,string *namepart)

{
  string local_38 [32];
  string *local_18;
  string *namepart_local;
  Tempfile *this_local;
  
  local_18 = namepart;
  namepart_local = (string *)this;
  std::__cxx11::string::string(local_38,(string *)namepart);
  TempEntry::TempEntry(&this->super_TempEntry,(string *)local_38);
  std::__cxx11::string::~string(local_38);
  (this->super_TempEntry)._vptr_TempEntry = (_func_int **)&PTR__Tempfile_0011dcd0;
  Path::touch(&(this->super_TempEntry).m_path);
  return;
}

Assistant:

Tempfile::Tempfile(std::string namepart)
  : TempEntry(namepart)
{
  m_path.touch();
}